

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O2

void __thiscall FNodeBuilder::GroupSegPlanes(FNodeBuilder *this)

{
  FSimpleVert FVar1;
  int y;
  int x;
  int y_00;
  int iVar2;
  FPrivSeg *pFVar3;
  FPrivSeg *pFVar4;
  FPrivVert *pFVar5;
  FSimpleLine *pFVar6;
  angle_t aVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int dy;
  long lVar12;
  int iVar13;
  FPrivSeg *pFVar14;
  int dx;
  int local_8084;
  FSimpleVert local_8048;
  undefined8 local_8040;
  FPrivSeg *buckets [4096];
  
  lVar12 = 0;
  memset(buckets,0,0x8000);
  uVar8 = (this->Segs).Count;
  pFVar3 = (this->Segs).Array;
  uVar11 = 0;
  if (0 < (int)uVar8) {
    uVar11 = (ulong)uVar8;
  }
  iVar13 = 1;
  for (; uVar11 * 0x48 - lVar12 != 0; lVar12 = lVar12 + 0x48) {
    *(int *)((long)&pFVar3->next + lVar12) = iVar13;
    *(undefined8 *)((long)&pFVar3->hashnext + lVar12) = 0;
    iVar13 = iVar13 + 1;
  }
  pFVar3[uVar8 - 1].next = 0xffffffff;
  lVar12 = 0;
  local_8084 = 0;
  do {
    if ((int)uVar8 <= lVar12) {
      TArray<unsigned_char,_unsigned_char>::Reserve(&this->PlaneChecked,(local_8084 + 7) / 8);
      return;
    }
    pFVar4 = (this->Segs).Array;
    pFVar5 = (this->Vertices).Array;
    pFVar3 = pFVar4 + lVar12;
    iVar13 = pFVar5[pFVar4[lVar12].v1].super_FSimpleVert.x;
    y = pFVar5[pFVar4[lVar12].v1].super_FSimpleVert.y;
    x = pFVar5[pFVar4[lVar12].v2].super_FSimpleVert.x;
    y_00 = pFVar5[pFVar4[lVar12].v2].super_FSimpleVert.y;
    aVar7 = PointToAngle(x - iVar13,y_00 - y);
    uVar8 = aVar7 >> 0x13 & 0xfff;
    pFVar4 = buckets[uVar8];
    for (pFVar14 = pFVar4; pFVar14 != (FPrivSeg *)0x0; pFVar14 = pFVar14->hashnext) {
      pFVar5 = (this->Vertices).Array;
      iVar10 = pFVar5[pFVar14->v1].super_FSimpleVert.x;
      iVar2 = pFVar5[pFVar14->v1].super_FSimpleVert.y;
      dx = pFVar5[pFVar14->v2].super_FSimpleVert.x - iVar10;
      dy = pFVar5[pFVar14->v2].super_FSimpleVert.y - iVar2;
      iVar9 = PointOnSide(iVar13,y,iVar10,iVar2,dx,dy);
      if ((iVar9 == 0) && (iVar10 = PointOnSide(x,y_00,iVar10,iVar2,dx,dy), iVar10 == 0)) {
        iVar10 = pFVar14->planenum;
        pFVar3->planenum = iVar10;
        pFVar6 = (this->Planes).Array;
        iVar2 = pFVar6[iVar10].dx;
        if (iVar2 == 0) {
          iVar13 = pFVar6[iVar10].dy;
          if (((y < y_00) && (0 < iVar13)) || ((y_00 < y && (iVar13 < 0)))) {
            pFVar3->planefront = true;
          }
          else {
            pFVar3->planefront = false;
          }
        }
        else if (((iVar13 < x) && (0 < iVar2)) || ((x < iVar13 && (iVar2 < 0)))) {
          pFVar3->planefront = true;
        }
        else {
          pFVar3->planefront = false;
        }
        goto LAB_00474161;
      }
    }
    pFVar3->hashnext = pFVar4;
    buckets[uVar8] = pFVar3;
    pFVar3->planenum = local_8084;
    local_8084 = local_8084 + 1;
    pFVar3->planefront = true;
    pFVar5 = (this->Vertices).Array;
    local_8048 = pFVar5[pFVar3->v1].super_FSimpleVert;
    FVar1 = pFVar5[pFVar3->v2].super_FSimpleVert;
    local_8040._0_4_ = FVar1.x - local_8048.x;
    local_8040._4_4_ = FVar1.y - local_8048.y;
    TArray<FNodeBuilder::FSimpleLine,_FNodeBuilder::FSimpleLine>::Push
              (&this->Planes,(FSimpleLine *)&local_8048);
LAB_00474161:
    lVar12 = lVar12 + 1;
    uVar8 = (this->Segs).Count;
  } while( true );
}

Assistant:

void FNodeBuilder::GroupSegPlanes ()
{
	const int bucketbits = 12;
	FPrivSeg *buckets[1<<bucketbits] = { 0 };
	int i, planenum;

	for (i = 0; i < (int)Segs.Size(); ++i)
	{
		FPrivSeg *seg = &Segs[i];
		seg->next = i+1;
		seg->hashnext = NULL;
	}

	Segs[Segs.Size()-1].next = DWORD_MAX;

	for (i = planenum = 0; i < (int)Segs.Size(); ++i)
	{
		FPrivSeg *seg = &Segs[i];
		fixed_t x1 = Vertices[seg->v1].x;
		fixed_t y1 = Vertices[seg->v1].y;
		fixed_t x2 = Vertices[seg->v2].x;
		fixed_t y2 = Vertices[seg->v2].y;
		angle_t ang = PointToAngle (x2 - x1, y2 - y1);

		if (ang >= 1u<<31)
			ang += 1u<<31;

		FPrivSeg *check = buckets[ang >>= 31-bucketbits];

		while (check != NULL)
		{
			fixed_t cx1 = Vertices[check->v1].x;
			fixed_t cy1 = Vertices[check->v1].y;
			fixed_t cdx = Vertices[check->v2].x - cx1;
			fixed_t cdy = Vertices[check->v2].y - cy1;
			if (PointOnSide (x1, y1, cx1, cy1, cdx, cdy) == 0 &&
				PointOnSide (x2, y2, cx1, cy1, cdx, cdy) == 0)
			{
				break;
			}
			check = check->hashnext;
		}
		if (check != NULL)
		{
			seg->planenum = check->planenum;
			const FSimpleLine *line = &Planes[seg->planenum];
			if (line->dx != 0)
			{
				if ((line->dx > 0 && x2 > x1) || (line->dx < 0 && x2 < x1))
				{
					seg->planefront = true;
				}
				else
				{
					seg->planefront = false;
				}
			}
			else
			{
				if ((line->dy > 0 && y2 > y1) || (line->dy < 0 && y2 < y1))
				{
					seg->planefront = true;
				}
				else
				{
					seg->planefront = false;
				}
			}
		}
		else
		{
			seg->hashnext = buckets[ang];
			buckets[ang] = seg;
			seg->planenum = planenum++;
			seg->planefront = true;

			FSimpleLine pline = { Vertices[seg->v1].x,
								  Vertices[seg->v1].y,
								  Vertices[seg->v2].x - Vertices[seg->v1].x,
								  Vertices[seg->v2].y - Vertices[seg->v1].y };
			Planes.Push (pline);
		}
	}

	D(Printf ("%d planes from %d segs\n", planenum, Segs.Size()));

	PlaneChecked.Reserve ((planenum + 7) / 8);
}